

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

tuple<bool,_float,_cv::Mat> *
removeBlurIfPresent(tuple<bool,_float,_cv::Mat> *__return_storage_ptr__,Mat *inputImg)

{
  float fVar1;
  Mat edges;
  Mat smoothened;
  Mat sharpened;
  undefined4 local_2e8 [2];
  Mat *local_2e0;
  undefined8 local_2d8;
  _OutputArray local_288;
  _InputArray local_270;
  _InputArray local_258;
  Mat local_240 [96];
  Mat local_1e0 [96];
  undefined4 local_180;
  undefined4 uStack_17c;
  Mat *local_178;
  undefined8 local_170 [12];
  Mat local_110 [96];
  Mat local_b0 [144];
  
  cv::Mat::Mat(local_1e0,inputImg);
  fVar1 = calculateEdginess(local_1e0);
  cv::Mat::~Mat(local_1e0);
  if (fVar1 <= 68.0) {
    cv::Mat::Mat((Mat *)__return_storage_ptr__,inputImg);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl = fVar1;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = 0;
  }
  else {
    cv::Mat::Mat(local_240);
    local_170[0] = 0;
    local_180 = 0x1010000;
    local_2d8 = 0;
    local_2e8[0] = 0x2010000;
    local_2e0 = local_240;
    local_178 = inputImg;
    cv::GaussianBlur(0x4014000000000000,0x4014000000000000);
    cv::operator-((Mat *)&local_180,inputImg);
    cv::Mat::Mat((Mat *)local_2e8);
    (**(code **)(*(long *)CONCAT44(uStack_17c,local_180) + 0x18))
              ((long *)CONCAT44(uStack_17c,local_180),(Mat *)&local_180,(Mat *)local_2e8,0xffffffff)
    ;
    cv::Mat::~Mat(local_b0);
    cv::Mat::~Mat(local_110);
    cv::Mat::~Mat((Mat *)local_170);
    cv::Mat::Mat((Mat *)&local_180);
    local_258.sz.width = 0;
    local_258.sz.height = 0;
    local_258.flags = 0x1010000;
    local_270.sz.width = 0;
    local_270.sz.height = 0;
    local_270.flags = 0x1010000;
    local_288.super__InputArray.sz.width = 0;
    local_288.super__InputArray.sz.height = 0;
    local_288.super__InputArray.flags = 0x2010000;
    local_288.super__InputArray.obj = (Mat *)&local_180;
    local_270.obj = (Mat *)local_2e8;
    local_258.obj = inputImg;
    cv::addWeighted(&local_258,1.0,&local_270,0.7,0.0,&local_288,-1);
    cv::Mat::Mat((Mat *)__return_storage_ptr__,(Mat *)&local_180);
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.super__Head_base<1UL,_float,_false>._M_head_impl = fVar1;
    (__return_storage_ptr__->super__Tuple_impl<0UL,_bool,_float,_cv::Mat>).
    super__Tuple_impl<1UL,_float,_cv::Mat>.field_0x64 = 1;
    cv::Mat::~Mat((Mat *)&local_180);
    cv::Mat::~Mat((Mat *)local_2e8);
    cv::Mat::~Mat(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<bool,float,Mat> removeBlurIfPresent(Mat const& inputImg) {
    float blurPercentage = calculateEdginess(inputImg);
    if (blurPercentage > 68) {
        Mat smoothened;
        GaussianBlur(inputImg, smoothened,Size(23, 23), 5,5);
        Mat edges = inputImg - smoothened;
        Mat sharpened;
        addWeighted(inputImg, 1, edges, 0.7, 0,sharpened);
        return make_tuple(true, blurPercentage, sharpened);
    } else {
        return make_tuple(false, blurPercentage, inputImg);
    }
}